

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O2

int isoent_gen_joliet_identifier(archive_write *a,isoent *isoent,idr *idr)

{
  uchar high;
  uchar low;
  void *pvVar1;
  isoent *isoent_00;
  ulong uVar2;
  int iVar3;
  wchar_t wVar4;
  uchar *__dest;
  int *piVar5;
  isofile *piVar6;
  char *pcVar7;
  int iVar8;
  int weight;
  uchar *puVar9;
  anon_struct_24_3_5bfd2c4c_for_children *paVar10;
  ulong uVar11;
  ulong uVar12;
  uchar *p;
  ulong __n;
  ulong uVar13;
  archive_rb_tree_ops *in_stack_ffffffffffffff78;
  
  iVar3 = (isoent->children).cnt;
  if (iVar3 != 0) {
    pvVar1 = a->format_data;
    uVar13 = 0x80;
    if ((*(uint *)((long)pvVar1 + 0x10370) & 0x60000) == 0x40000) {
      uVar13 = 0xce;
    }
    iVar3 = idr_start(a,idr,iVar3,6,2,0x29b0a0,in_stack_ffffffffffffff78);
    if (iVar3 < 0) {
      return iVar3;
    }
    paVar10 = &isoent->children;
    uVar12 = 1;
    while (isoent->parent != isoent) {
      uVar12 = uVar12 + (long)isoent->mb_len + 1;
      isoent = isoent->parent;
    }
    while (isoent_00 = paVar10->first, isoent_00 != (isoent *)0x0) {
      piVar6 = isoent_00->file;
      uVar2 = (piVar6->basename_utf16).length;
      __n = uVar13;
      if (uVar2 < uVar13) {
        __n = uVar2;
      }
      __dest = (uchar *)malloc((__n & 0xffffffff) * 2 + 2);
      if (__dest == (uchar *)0x0) {
        pcVar7 = "Can\'t allocate memory";
LAB_0016a8d3:
        archive_set_error(&a->archive,0xc,pcVar7);
        return -0x1e;
      }
      memcpy(__dest,(piVar6->basename_utf16).s,__n);
      (__dest + __n)[0] = '\0';
      (__dest + __n)[1] = '\0';
      puVar9 = __dest + __n;
      isoent_00->identifier = (char *)__dest;
      for (uVar11 = __n; uVar11 != 0; uVar11 = uVar11 - 2) {
        high = *__dest;
        low = __dest[1];
        iVar3 = joliet_allowed_char(high,low);
        if (iVar3 == 0) {
          __dest[0] = '\0';
          __dest[1] = '_';
        }
        else if ((high == '\0') && (low == '.')) {
          puVar9 = __dest;
        }
        __dest = __dest + 2;
      }
      piVar6 = isoent_00->file;
      iVar3 = (int)puVar9 - (int)isoent_00->identifier;
      isoent_00->ext_off = iVar3;
      isoent_00->ext_len = (int)__n - iVar3;
      isoent_00->id_len = (int)__n;
      if (uVar13 < (piVar6->basename_utf16).length) {
        wVar4 = archive_strncpy_l((archive_string *)((long)pvVar1 + 0x60),isoent_00->identifier,__n,
                                  *(archive_string_conv **)((long)pvVar1 + 0x80));
        if ((wVar4 != L'\0') && (piVar5 = __errno_location(), *piVar5 == 0xc)) {
          pcVar7 = "No memory";
          goto LAB_0016a8d3;
        }
        iVar8 = *(int *)((long)pvVar1 + 0x68);
        isoent_00->mb_len = iVar8;
        piVar6 = isoent_00->file;
        weight = iVar8;
        if (iVar8 == (int)(piVar6->basename).length) {
          weight = 0;
        }
      }
      else {
        iVar8 = (int)(piVar6->basename).length;
        isoent_00->mb_len = iVar8;
        weight = 0;
      }
      if (((0xf0 < uVar12) || (0xf0 < iVar8)) || (0xf0 < (long)iVar8 + uVar12)) {
        pcVar7 = archive_entry_pathname(piVar6->entry);
        archive_set_error(&a->archive,-1,
                          "The regulation of Joliet extensions; A length of a full-pathname of `%s\' is longer than 240 bytes, (p=%d, b=%d)"
                          ,pcVar7,uVar12 & 0xffffffff,(ulong)(uint)isoent_00->mb_len);
        return -0x1e;
      }
      if (uVar2 < uVar13) {
        if (__n == uVar13 - 2) {
          iVar8 = iVar3 + -4;
        }
        else {
          iVar8 = iVar3 + -2;
          if (__n != uVar13 - 4) {
            iVar8 = iVar3;
          }
        }
      }
      else {
        iVar8 = iVar3 + -6;
      }
      idr_register(idr,isoent_00,weight,iVar8);
      paVar10 = (anon_struct_24_3_5bfd2c4c_for_children *)&isoent_00->chnext;
    }
    idr_resolve(idr,idr_set_num_beutf16);
  }
  return 0;
}

Assistant:

static int
isoent_gen_joliet_identifier(struct archive_write *a, struct isoent *isoent,
    struct idr *idr)
{
	struct iso9660 *iso9660;
	struct isoent *np;
	unsigned char *p;
	size_t l;
	int r;
	size_t ffmax, parent_len;
	static const struct archive_rb_tree_ops rb_ops = {
		isoent_cmp_node_joliet, isoent_cmp_key_joliet
	};

	if (isoent->children.cnt == 0)
		return (0);

	iso9660 = a->format_data;
	if (iso9660->opt.joliet == OPT_JOLIET_LONGNAME)
		ffmax = 206;
	else
		ffmax = 128;

	r = idr_start(a, idr, isoent->children.cnt, (int)ffmax, 6, 2, &rb_ops);
	if (r < 0)
		return (r);

	parent_len = 1;
	for (np = isoent; np->parent != np; np = np->parent)
		parent_len += np->mb_len + 1;

	for (np = isoent->children.first; np != NULL; np = np->chnext) {
		unsigned char *dot;
		int ext_off, noff, weight;
		size_t lt;

		if ((l = np->file->basename_utf16.length) > ffmax)
			l = ffmax;

		p = malloc((l+1)*2);
		if (p == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory");
			return (ARCHIVE_FATAL);
		}
		memcpy(p, np->file->basename_utf16.s, l);
		p[l] = 0;
		p[l+1] = 0;

		np->identifier = (char *)p;
		lt = l;
		dot = p + l;
		weight = 0;
		while (lt > 0) {
			if (!joliet_allowed_char(p[0], p[1]))
				archive_be16enc(p, 0x005F); /* '_' */
			else if (p[0] == 0 && p[1] == 0x2E) /* '.' */
				dot = p;
			p += 2;
			lt -= 2;
		}
		ext_off = (int)(dot - (unsigned char *)np->identifier);
		np->ext_off = ext_off;
		np->ext_len = (int)l - ext_off;
		np->id_len = (int)l;

		/*
		 * Get a length of MBS of a full-pathname.
		 */
		if (np->file->basename_utf16.length > ffmax) {
			if (archive_strncpy_l(&iso9660->mbs,
			    (const char *)np->identifier, l,
				iso9660->sconv_from_utf16be) != 0 &&
			    errno == ENOMEM) {
				archive_set_error(&a->archive, errno,
				    "No memory");
				return (ARCHIVE_FATAL);
			}
			np->mb_len = (int)iso9660->mbs.length;
			if (np->mb_len != (int)np->file->basename.length)
				weight = np->mb_len;
		} else
			np->mb_len = (int)np->file->basename.length;

		/* If a length of full-pathname is longer than 240 bytes,
		 * it violates Joliet extensions regulation. */
		if (parent_len > 240
		    || np->mb_len > 240
		    || parent_len + np->mb_len > 240) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "The regulation of Joliet extensions;"
			    " A length of a full-pathname of `%s' is "
			    "longer than 240 bytes, (p=%d, b=%d)",
			    archive_entry_pathname(np->file->entry),
			    (int)parent_len, (int)np->mb_len);
			return (ARCHIVE_FATAL);
		}

		/* Make an offset of the number which is used to be set
		 * hexadecimal number to avoid duplicate identifier. */
		if (l == ffmax)
			noff = ext_off - 6;
		else if (l == ffmax-2)
			noff = ext_off - 4;
		else if (l == ffmax-4)
			noff = ext_off - 2;
		else
			noff = ext_off;
		/* Register entry to the identifier resolver. */
		idr_register(idr, np, weight, noff);
	}

	/* Resolve duplicate identifier with Joliet Volume. */
	idr_resolve(idr, idr_set_num_beutf16);

	return (ARCHIVE_OK);
}